

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::vector<unsigned_int>::resize(vector<unsigned_int> *this,uint32 new_size)

{
  bool bVar1;
  uint in_ESI;
  uint *in_RDI;
  uint32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI[2] != in_ESI) {
    if (in_ESI < in_RDI[2]) {
      scalar_type<unsigned_int>::destruct_array
                ((uint *)(*(long *)in_RDI + (ulong)in_ESI * 4),in_RDI[2] - in_ESI);
    }
    else {
      if ((in_RDI[3] < in_ESI) &&
         (bVar1 = increase_capacity((vector<unsigned_int> *)
                                    CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (uint32)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)),
         !bVar1)) {
        return false;
      }
      scalar_type<unsigned_int>::construct_array(in_RDI,in_stack_ffffffffffffffdc);
    }
    in_RDI[2] = in_ESI;
  }
  return true;
}

Assistant:

inline bool resize(uint32 new_size) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity) {
          if (!increase_capacity(new_size, new_size == (m_size + 1)))
            return false;
        }

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }

    return true;
  }